

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_elfread.c
# Opt level: O0

int elf_load_nolibelf_section
              (void *obj,Dwarf_Unsigned section_index,Dwarf_Small **return_data,int *error)

{
  Dwarf_Unsigned DVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  generic_shdr *sp;
  int res;
  dwarf_elf_object_access_internals_t *elf;
  Dwarf_Small *read_target;
  Dwarf_Unsigned remaining_bytes;
  Dwarf_Unsigned read_size;
  Dwarf_Unsigned read_offset;
  Dwarf_Unsigned read_size_limit;
  int *error_local;
  Dwarf_Small **return_data_local;
  Dwarf_Unsigned section_index_local;
  void *obj_local;
  
  if ((section_index == 0) || (*(ulong *)((long)obj + 0xa0) <= section_index)) {
    obj_local._4_4_ = -1;
  }
  else {
    lVar3 = *(long *)((long)obj + 0xb8) + section_index * 0xa0;
    if (*(long *)(lVar3 + 0x68) == 0) {
      if (*(long *)(lVar3 + 0x38) == 0) {
        obj_local._4_4_ = -1;
      }
      else if (((*(ulong *)((long)obj + 0x28) < *(ulong *)(lVar3 + 0x38)) ||
               (*(ulong *)((long)obj + 0x28) < *(ulong *)(lVar3 + 0x30))) ||
              (*(ulong *)((long)obj + 0x28) <
               (ulong)(*(long *)(lVar3 + 0x38) + *(long *)(lVar3 + 0x30)))) {
        *error = 0x1be;
        obj_local._4_4_ = 1;
      }
      else {
        pvVar4 = malloc(*(size_t *)(lVar3 + 0x38));
        *(void **)(lVar3 + 0x68) = pvVar4;
        if (*(long *)(lVar3 + 0x68) == 0) {
          *error = 0x3e;
          obj_local._4_4_ = 1;
        }
        else {
          read_size = *(Dwarf_Unsigned *)(lVar3 + 0x30);
          elf = *(dwarf_elf_object_access_internals_t **)(lVar3 + 0x68);
          for (remaining_bytes = *(Dwarf_Unsigned *)(lVar3 + 0x38); DVar1 = remaining_bytes,
              remaining_bytes != 0; remaining_bytes = DVar1 - remaining_bytes) {
            if (0x7ff00000 < remaining_bytes) {
              remaining_bytes = 0x7ff00000;
            }
            iVar2 = _dwarf_object_read_random
                              (*(int *)((long)obj + 0x10),elf->f_ident,read_size,remaining_bytes,
                               *(Dwarf_Unsigned *)((long)obj + 0x28),error);
            if (iVar2 != 0) {
              free(*(void **)(lVar3 + 0x68));
              *(undefined8 *)(lVar3 + 0x68) = 0;
              return iVar2;
            }
            read_size = remaining_bytes + read_size;
            elf = (dwarf_elf_object_access_internals_t *)(elf->f_ident + remaining_bytes);
          }
          *return_data = *(Dwarf_Small **)(lVar3 + 0x68);
          obj_local._4_4_ = 0;
        }
      }
    }
    else {
      *return_data = *(Dwarf_Small **)(lVar3 + 0x68);
      obj_local._4_4_ = 0;
    }
  }
  return obj_local._4_4_;
}

Assistant:

static int
elf_load_nolibelf_section (void *obj, Dwarf_Unsigned section_index,
    Dwarf_Small **return_data, int *error)
{
    /*  Linux kernel read size limit 0x7ffff000,
        Without any good reason, limit our reads
        to a bit less. */
    const Dwarf_Unsigned read_size_limit = 0x7ff00000;
    Dwarf_Unsigned read_offset = 0;
    Dwarf_Unsigned read_size = 0;
    Dwarf_Unsigned remaining_bytes = 0;
    Dwarf_Small *  read_target = 0;
    dwarf_elf_object_access_internals_t *elf =
        (dwarf_elf_object_access_internals_t*)(obj);

    if (0 < section_index &&
        section_index < elf->f_loc_shdr.g_count) {
        int res = 0;

        struct generic_shdr *sp =
            elf->f_shdr + section_index;
        if (sp->gh_content) {
            *return_data = (Dwarf_Small *)sp->gh_content;
            return DW_DLV_OK;
        }
        if (!sp->gh_size) {
            return DW_DLV_NO_ENTRY;
        }
        /*  Guarding against bad values and
            against overflow */
        if (sp->gh_size > elf->f_filesize ||
            sp->gh_offset > elf->f_filesize ||
            (sp->gh_size + sp->gh_offset) >
                elf->f_filesize) {
            *error = DW_DLE_ELF_SECTION_ERROR;
            return DW_DLV_ERROR;
        }

        sp->gh_content = malloc((size_t)sp->gh_size);
        if (!sp->gh_content) {
            *error = DW_DLE_ALLOC_FAIL;
            return DW_DLV_ERROR;
        }
        /*  Linux has a 2GB limit on read size.
            So break this into 2gb pieces.  */
        remaining_bytes = sp->gh_size;
        read_size = remaining_bytes;
        read_offset = sp->gh_offset;
        read_target = (Dwarf_Small*)sp->gh_content;
        for ( ; remaining_bytes > 0; read_size = remaining_bytes ) {
            if (read_size > read_size_limit) {
                read_size = read_size_limit;
            }
            res = RRMOA(elf->f_fd,
                (void *)read_target, read_offset,
                read_size,
                elf->f_filesize, error);
            if (res != DW_DLV_OK) {
                free(sp->gh_content);
                sp->gh_content = 0;
                return res;
            }
            remaining_bytes -= read_size;
            read_offset += read_size;
            read_target += read_size;
        }
        *return_data = (Dwarf_Small *)sp->gh_content;
        return DW_DLV_OK;
    }
    return DW_DLV_NO_ENTRY;
}